

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-stairs.c
# Opt level: O2

int borg_flow_cost_stair(int y,int x,int b_stair)

{
  uint uVar1;
  
  borg_flow_clear();
  if (b_stair == -1) {
    uVar1 = 0;
  }
  else {
    borg_flow_enqueue_grid(track_less.y[b_stair],track_less.x[b_stair]);
    borg_flow_spread(L'ú',false,false,false,b_stair,false);
    uVar1 = (uint)borg_data_cost->data[y][x];
  }
  return uVar1;
}

Assistant:

int borg_flow_cost_stair(int y, int x, int b_stair)
{
    int cost = 255;

    /* Clear the flow codes */
    borg_flow_clear();

    /* Paranoid */
    if (b_stair == -1)
        return 0;

    /* Enqueue the player's grid */
    borg_flow_enqueue_grid(track_less.y[b_stair], track_less.x[b_stair]);

    /* Spread, but do NOT optimize */
    borg_flow_spread(250, false, false, false, b_stair, false);

    /* Distance from the grid to the stair */
    cost = borg_data_cost->data[y][x];

    return (cost);
}